

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O2

Matrix<int> __thiscall Matrix<int>::operator=(Matrix<int> *this,Matrix<int> *R)

{
  long lVar1;
  int **ppiVar2;
  int i;
  long lVar3;
  int iVar4;
  int *in_RDX;
  int **extraout_RDX;
  int iVar5;
  int j;
  long lVar6;
  Matrix<int> MVar7;
  
  iVar5 = *in_RDX;
  R->n = iVar5;
  iVar4 = in_RDX[1];
  R->m = iVar4;
  for (lVar3 = 0; lVar3 < iVar5; lVar3 = lVar3 + 1) {
    lVar1 = *(long *)(in_RDX + 2);
    ppiVar2 = R->M;
    for (lVar6 = 0; lVar6 < iVar4; lVar6 = lVar6 + 1) {
      ppiVar2[lVar3][lVar6] = *(int *)(*(long *)(lVar1 + lVar3 * 8) + lVar6 * 4);
      iVar4 = in_RDX[1];
    }
    iVar5 = *in_RDX;
  }
  Matrix(this,R);
  MVar7.M = extraout_RDX;
  MVar7._0_8_ = this;
  return MVar7;
}

Assistant:

Matrix operator=(const Matrix& R) {
    n = R.n;
    m = R.m;
    for (int i = 0; i < R.n; i++) {
      for (int j = 0; j < R.m; j++) {
        M[i][j] = R.M[i][j];
      }
    }
    return *this;
  }